

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.cpp
# Opt level: O0

size_t helics::detail::convertToBinary(byte *data,string_view val)

{
  bool bVar1;
  void *__dest;
  const_pointer __src;
  size_type sVar2;
  long in_RDI;
  byte in_stack_ffffffffffffffcf;
  byte *in_stack_ffffffffffffffd0;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
  addCodeAndSize(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf,0x4503b9);
  bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_10);
  if (!bVar1) {
    __dest = (void *)(in_RDI + 8);
    __src = CLI::std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
    sVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
    memcpy(__dest,__src,sVar2);
  }
  sVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
  return sVar2 + 8;
}

Assistant:

size_t convertToBinary(std::byte* data, std::string_view val)
{
    addCodeAndSize(data, stringCode, val.size());
    if (!val.empty()) {
        std::memcpy(data + 8U, val.data(), val.size());
    }
    return val.size() + 8U;
}